

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.h
# Opt level: O0

int decoder_get_var(ndn_decoder_t *decoder,uint32_t *var)

{
  byte bVar1;
  uint uVar2;
  uint32_t rest_size;
  uint8_t first_bit;
  uint32_t *var_local;
  ndn_decoder_t *decoder_local;
  
  bVar1 = decoder->input_value[decoder->offset];
  uVar2 = decoder->input_size - decoder->offset;
  if (bVar1 < 0xfd) {
    *var = (uint)bVar1;
    decoder->offset = decoder->offset + 1;
  }
  else if ((bVar1 == 0xfd) && (2 < uVar2)) {
    *var = (uint)decoder->input_value[decoder->offset + 1] * 0x100 +
           (uint)decoder->input_value[decoder->offset + 2];
    decoder->offset = decoder->offset + 3;
  }
  else {
    if ((bVar1 != 0xfe) || (uVar2 < 5)) {
      return -0xe;
    }
    *var = (uint)decoder->input_value[decoder->offset + 1] * 0x1000000 +
           (uint)decoder->input_value[decoder->offset + 2] * 0x10000 +
           (uint)decoder->input_value[decoder->offset + 3] * 0x100 +
           (uint)decoder->input_value[decoder->offset + 4];
    decoder->offset = decoder->offset + 5;
  }
  return 0;
}

Assistant:

static inline int
decoder_get_var(ndn_decoder_t* decoder, uint32_t* var)
{
  uint8_t first_bit = decoder->input_value[decoder->offset];
  uint32_t rest_size = decoder->input_size - decoder->offset;
  if (first_bit < 253) {
    *var = first_bit;
    decoder->offset += 1;
  }
  else if (first_bit == 253 && rest_size >= 3) {
    *var = ((uint32_t)decoder->input_value[decoder->offset + 1] << 8)
      + decoder->input_value[decoder->offset + 2];
    decoder->offset += 3;
  }
  else if (first_bit == 254 && rest_size >= 5) {
    *var = ((uint32_t)decoder->input_value[decoder->offset + 1] << 24)
      + ((uint32_t)decoder->input_value[decoder->offset + 2] << 16)
      + ((uint32_t)decoder->input_value[decoder->offset + 3] << 8)
      + decoder->input_value[decoder->offset + 4];
    decoder->offset += 5;
  }
  else {
    return NDN_OVERSIZE_VAR;
  }
  return 0;
}